

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JavascriptGenerator.cpp
# Opt level: O0

void __thiscall
Js::JavascriptGenerator::JavascriptGenerator
          (JavascriptGenerator *this,DynamicType *type,Arguments *args,
          ScriptFunction *scriptFunction)

{
  nullptr_t local_40;
  nullptr_t local_38;
  nullptr_t local_30;
  ScriptFunction *local_28;
  ScriptFunction *scriptFunction_local;
  Arguments *args_local;
  DynamicType *type_local;
  JavascriptGenerator *this_local;
  
  local_28 = scriptFunction;
  scriptFunction_local = (ScriptFunction *)args;
  args_local = (Arguments *)type;
  type_local = (DynamicType *)this;
  DynamicObject::DynamicObject(&this->super_DynamicObject,type,true);
  (this->super_DynamicObject).super_RecyclableObject.super_FinalizableObject.
  super_IRecyclerVisitedObject._vptr_IRecyclerVisitedObject = (_func_int **)&PTR_Finalize_01e060f8;
  local_30 = (nullptr_t)0x0;
  Memory::WriteBarrierPtr<Js::InterpreterStackFrame>::WriteBarrierPtr(&this->frame,&local_30);
  this->state = SuspendedStart;
  Arguments::Arguments(&this->args,(Arguments *)scriptFunction_local);
  Memory::WriteBarrierPtr<Js::ScriptFunction>::WriteBarrierPtr(&this->scriptFunction,local_28);
  local_38 = (nullptr_t)0x0;
  Memory::WriteBarrierPtr<Js::DynamicObject>::WriteBarrierPtr(&this->resumeYieldObject,&local_38);
  local_40 = (nullptr_t)0x0;
  Memory::WriteBarrierPtr<Js::JavascriptGenerator::BailInSymbol>::WriteBarrierPtr
            (&this->bailInSymbolsTraceArray,&local_40);
  this->bailInSymbolsTraceArrayCount = 0;
  return;
}

Assistant:

JavascriptGenerator::JavascriptGenerator(
    DynamicType* type,
    Arguments& args,
    ScriptFunction* scriptFunction) :
        DynamicObject(type),
        args(args),
        frame(nullptr),
        state(GeneratorState::SuspendedStart),
        scriptFunction(scriptFunction),
        resumeYieldObject(nullptr) {}